

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__zexpand(stbi__zbuf *z,char *zout,int n)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int old_limit;
  int limit;
  int cur;
  char *q;
  int local_30;
  int local_4;
  
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  if (*(int *)(in_RDI + 0x30) == 0) {
    local_4 = stbi__err("output buffer limit");
  }
  else {
    iVar1 = (int)*(undefined8 *)(in_RDI + 0x18) - (int)*(undefined8 *)(in_RDI + 0x20);
    for (local_30 = (int)*(undefined8 *)(in_RDI + 0x28) - (int)*(undefined8 *)(in_RDI + 0x20);
        local_30 < iVar1 + in_EDX; local_30 = local_30 << 1) {
    }
    pvVar2 = realloc(*(void **)(in_RDI + 0x20),(long)local_30);
    if (pvVar2 == (void *)0x0) {
      local_4 = stbi__err("outofmem");
    }
    else {
      *(void **)(in_RDI + 0x20) = pvVar2;
      *(long *)(in_RDI + 0x18) = (long)pvVar2 + (long)iVar1;
      *(long *)(in_RDI + 0x28) = (long)pvVar2 + (long)local_30;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int stbi__zexpand(stbi__zbuf *z, char *zout, int n)  // need to make room for n bytes
{
   char *q;
   int cur, limit, old_limit;
   z->zout = zout;
   if (!z->z_expandable) return stbi__err("output buffer limit","Corrupt PNG");
   cur   = (int) (z->zout     - z->zout_start);
   limit = old_limit = (int) (z->zout_end - z->zout_start);
   while (cur + n > limit)
      limit *= 2;
   q = (char *) STBI_REALLOC_SIZED(z->zout_start, old_limit, limit);
   STBI_NOTUSED(old_limit);
   if (q == NULL) return stbi__err("outofmem", "Out of memory");
   z->zout_start = q;
   z->zout       = q + cur;
   z->zout_end   = q + limit;
   return 1;
}